

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Loop.H
# Opt level: O0

void amrex::
     LoopConcurrentOnCpu<amrex::FaceLinear::interp_face(amrex::FArrayBox_const&,int,amrex::FArrayBox&,int,int,amrex::Box_const&,amrex::IntVect_const&,amrex::IArrayBox_const&,amrex::Geometry_const&,amrex::Geometry_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,amrex::RunOn)::__1>
               (Box *bx,int ncomp,anon_class_208_4_47071d10 *f)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int in_ESI;
  int *in_RDI;
  int i;
  int j;
  int k;
  int n;
  Dim3 hi;
  Dim3 lo;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  int in_stack_ffffffffffffff10;
  undefined8 uVar4;
  int i_00;
  anon_class_208_4_47071d10 *this;
  
  iVar1 = *in_RDI;
  iVar2 = in_RDI[1];
  this = *(anon_class_208_4_47071d10 **)in_RDI;
  iVar3 = in_RDI[2];
  uVar4 = *(undefined8 *)(in_RDI + 3);
  i_00 = in_RDI[5];
  for (local_104 = 0; local_108 = iVar3, local_104 < in_ESI; local_104 = local_104 + 1) {
    for (; local_10c = iVar2, local_108 <= i_00; local_108 = local_108 + 1) {
      for (; local_110 = iVar1, local_10c <= (int)((ulong)uVar4 >> 0x20); local_10c = local_10c + 1)
      {
        for (; local_110 <= (int)uVar4; local_110 = local_110 + 1) {
          FaceLinear::interp_face::anon_class_208_4_47071d10::operator()
                    (this,i_00,(int)((ulong)uVar4 >> 0x20),(int)uVar4,in_stack_ffffffffffffff10);
        }
      }
    }
  }
  return;
}

Assistant:

void LoopConcurrentOnCpu (Box const& bx, int ncomp, F&& f) noexcept
{
    const auto lo = amrex::lbound(bx);
    const auto hi = amrex::ubound(bx);
    for (int n = 0; n < ncomp; ++n) {
    for (int k = lo.z; k <= hi.z; ++k) {
    for (int j = lo.y; j <= hi.y; ++j) {
    AMREX_PRAGMA_SIMD
    for (int i = lo.x; i <= hi.x; ++i) {
        f(i,j,k,n);
    }}}}
}